

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

VarValue *
deqp::gles2::Functional::generateRandomVarValue
          (VarValue *__return_storage_ptr__,DataType type,Random *rnd,int samplerUnit)

{
  uint uVar1;
  deUint32 dVar2;
  uint uVar3;
  deBool dVar4;
  undefined4 extraout_var;
  VarValue *extraout_RAX;
  undefined4 extraout_var_00;
  VarValue *extraout_RAX_00;
  ulong uVar6;
  int i;
  long lVar7;
  float fVar8;
  VarValue *pVVar5;
  
  uVar1 = glu::getDataTypeScalarSize(type);
  pVVar5 = (VarValue *)CONCAT44(extraout_var,uVar1);
  __return_storage_ptr__->type = type;
  if ((type - TYPE_FLOAT < 4) || (type - TYPE_FLOAT_MAT2 < 9 || type - TYPE_DOUBLE_MAT2 < 9)) {
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        fVar8 = deRandom_getFloat(&rnd->m_rnd);
        *(float *)((long)&__return_storage_ptr__->val + uVar6 * 4) = fVar8 * 20.0 + -10.0;
        uVar6 = uVar6 + 1;
        pVVar5 = extraout_RAX;
      } while (uVar1 != uVar6);
    }
  }
  else if (type - TYPE_INT < 4) {
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        dVar2 = deRandom_getUint32(&rnd->m_rnd);
        uVar3 = dVar2 % 0x15 - 10;
        pVVar5 = (VarValue *)(ulong)uVar3;
        *(uint *)((long)&__return_storage_ptr__->val + uVar6 * 4) = uVar3;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  else if (type - TYPE_BOOL < 4) {
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        dVar4 = deRandom_getBool(&rnd->m_rnd);
        pVVar5 = (VarValue *)CONCAT44(extraout_var_00,dVar4);
        (__return_storage_ptr__->val).boolV[uVar6] = dVar4 == 1;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  else if (type - TYPE_SAMPLER_1D < 0x1e) {
    (__return_storage_ptr__->val).samplerV.unit = samplerUnit;
    lVar7 = 0;
    do {
      fVar8 = deRandom_getFloat(&rnd->m_rnd);
      *(float *)((long)&__return_storage_ptr__->val + lVar7 * 4 + 4) = fVar8 + 0.0;
      lVar7 = lVar7 + 1;
      pVVar5 = extraout_RAX_00;
    } while (lVar7 != 4);
  }
  return pVVar5;
}

Assistant:

static VarValue generateRandomVarValue (const glu::DataType type, Random& rnd, int samplerUnit = -1 /* Used if type is a sampler type. \note Samplers' unit numbers are not randomized. */)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	DE_ASSERT((samplerUnit >= 0) == (glu::isDataTypeSampler(type)));

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = rnd.getFloat(-10.0f, 10.0f);
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = rnd.getInt(-10, 10);
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = rnd.getBool();
	}
	else if (glu::isDataTypeSampler(type))
	{
		result.val.samplerV.unit = samplerUnit;

		for (int i = 0; i < 4; i++)
			result.val.samplerV.fillColor[i] = rnd.getFloat(0.0f, 1.0f);
	}
	else
		DE_ASSERT(false);

	return result;
}